

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_nil(FuncState *fs,BCReg from,BCReg n)

{
  uint *puVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  BCReg pfrom;
  BCReg pto;
  BCIns *ip;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_10;
  uint local_c;
  
  if (*(uint *)(in_RDI + 0x2c) < *(uint *)(in_RDI + 0x28)) {
    puVar1 = (uint *)(*(long *)(in_RDI + 0x48) + (ulong)(*(int *)(in_RDI + 0x28) - 1) * 8);
    in_stack_ffffffffffffffe0 = (uint)*(byte *)((long)puVar1 + 1);
    in_stack_ffffffffffffffdc = (uint)(byte)*puVar1;
    if (in_stack_ffffffffffffffdc == 0x2b) {
      if (*puVar1 >> 0x10 == 0) {
        if (in_ESI == in_stack_ffffffffffffffe0) {
          local_10 = in_EDX;
          local_c = in_ESI;
          if (in_EDX == 1) {
            return;
          }
        }
        else {
          if (in_ESI != in_stack_ffffffffffffffe0 + 1) goto LAB_0015378d;
          local_10 = in_EDX + 1;
          local_c = in_stack_ffffffffffffffe0;
        }
        *puVar1 = local_c << 8 | 0x2c | (local_c + local_10 + -1) * 0x10000;
        return;
      }
    }
    else if (((in_stack_ffffffffffffffdc == 0x2c) &&
             (in_stack_ffffffffffffffe4 = *puVar1 >> 0x10, in_stack_ffffffffffffffe0 <= in_ESI)) &&
            (in_ESI <= in_stack_ffffffffffffffe4 + 1)) {
      if ((in_ESI + in_EDX) - 1 <= in_stack_ffffffffffffffe4) {
        return;
      }
      *(short *)((long)puVar1 + 2) = (short)in_ESI + (short)in_EDX + -1;
      return;
    }
  }
LAB_0015378d:
  bcemit_INS((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void bcemit_nil(FuncState *fs, BCReg from, BCReg n)
{
  if (fs->pc > fs->lasttarget) {  /* No jumps to current position? */
    BCIns *ip = &fs->bcbase[fs->pc-1].ins;
    BCReg pto, pfrom = bc_a(*ip);
    switch (bc_op(*ip)) {  /* Try to merge with the previous instruction. */
    case BC_KPRI:
      if (bc_d(*ip) != ~LJ_TNIL) break;
      if (from == pfrom) {
	if (n == 1) return;
      } else if (from == pfrom+1) {
	from = pfrom;
	n++;
      } else {
	break;
      }
      *ip = BCINS_AD(BC_KNIL, from, from+n-1);  /* Replace KPRI. */
      return;
    case BC_KNIL:
      pto = bc_d(*ip);
      if (pfrom <= from && from <= pto+1) {  /* Can we connect both ranges? */
	if (from+n-1 > pto)
	  setbc_d(ip, from+n-1);  /* Patch previous instruction range. */
	return;
      }
      break;
    default:
      break;
    }
  }
  /* Emit new instruction or replace old instruction. */
  bcemit_INS(fs, n == 1 ? BCINS_AD(BC_KPRI, from, VKNIL) :
			  BCINS_AD(BC_KNIL, from, from+n-1));
}